

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780Analyzer.cpp
# Opt level: O0

void __thiscall HD44780Analyzer::WorkerThread(HD44780Analyzer *this)

{
  byte bVar1;
  U32 UVar2;
  int iVar3;
  AnalyzerChannelData *pAVar4;
  element_type *peVar5;
  ulong uVar6;
  auto_ptr<HD44780AnalyzerSettings> *this_00;
  Channel local_48 [32];
  Channel local_28 [20];
  uint local_14;
  HD44780Analyzer *pHStack_10;
  U32 dbline;
  HD44780Analyzer *this_local;
  
  pHStack_10 = this;
  UVar2 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar2;
  this_00 = &this->mSettings;
  std::auto_ptr<HD44780AnalyzerSettings>::operator->(this_00);
  pAVar4 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mE = pAVar4;
  std::auto_ptr<HD44780AnalyzerSettings>::operator->(this_00);
  pAVar4 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mRS = pAVar4;
  peVar5 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(this_00);
  Channel::Channel(local_28,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  bVar1 = Channel::operator!=(&peVar5->mRWChannel,local_28);
  Channel::~Channel(local_28);
  if ((bVar1 & 1) == 0) {
    this->mRW = (AnalyzerChannelData *)0x0;
  }
  else {
    std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
    pAVar4 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
    this->mRW = pAVar4;
  }
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    peVar5 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
    uVar6 = (ulong)local_14;
    Channel::Channel(local_48,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    bVar1 = Channel::operator!=((Channel *)(&peVar5->field_0x40 + uVar6 * 0x10),local_48);
    Channel::~Channel(local_48);
    if ((bVar1 & 1) == 0) {
      this->mDB[local_14] = (AnalyzerChannelData *)0x0;
    }
    else {
      std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
      pAVar4 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
      this->mDB[local_14] = pAVar4;
    }
  }
  iVar3 = AnalyzerChannelData::GetBitState();
  if (iVar3 == 1) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  peVar5 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
  this->bitmode8 = (bool)((peVar5->mStartIn4BitMode ^ 0xffU) & 1);
  this->mLastEStart = 0;
  this->mWaitBusy = 0;
  do {
    GetTransfer(this);
    Analyzer::CheckIfThreadShouldExit();
  } while( true );
}

Assistant:

void HD44780Analyzer::WorkerThread()
{
    U32 dbline;

    // get sample rate
    mSampleRateHz = GetSampleRate();

    // setup channels
    mE = GetAnalyzerChannelData( mSettings->mEChannel );
    mRS = GetAnalyzerChannelData( mSettings->mRSChannel );
    if( mSettings->mRWChannel != UNDEFINED_CHANNEL )
        mRW = GetAnalyzerChannelData( mSettings->mRWChannel );
    else
        mRW = NULL;
    for( dbline = 0; dbline < 8; dbline++ )
        if( mSettings->mDBChannel[ dbline ] != UNDEFINED_CHANNEL )
            mDB[ dbline ] = GetAnalyzerChannelData( mSettings->mDBChannel[ dbline ] );
        else
            mDB[ dbline ] = NULL;

    // if we start high we need to move to low
    if( mE->GetBitState() == BIT_HIGH )
        mE->AdvanceToNextEdge();

    // we always start in 8-bit mode unless the force 4-bit mode option is selected
    // function set command can change modes
    bitmode8 = !mSettings->mStartIn4BitMode;

    // reset between E high pulse measurements
    mLastEStart = 0;

    // reset busy mode
    mWaitBusy = 0;

    // get frames
    for( ;; )
    {
        GetTransfer();
        CheckIfThreadShouldExit();
    }
}